

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier.h
# Opt level: O3

void __thiscall
bezier::Bezier<3UL>::Bezier
          (Bezier<3UL> *this,vector<bezier::Vec2,_std::allocator<bezier::Vec2>_> *controlPoints)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pVVar3;
  undefined8 uVar4;
  pointer pVVar5;
  long lVar6;
  ulong uVar7;
  
  (this->mControlPoints)._M_elems[3].x = 0.0;
  (this->mControlPoints)._M_elems[3].y = 0.0;
  (this->mControlPoints)._M_elems[2].x = 0.0;
  (this->mControlPoints)._M_elems[2].y = 0.0;
  (this->mControlPoints)._M_elems[1].x = 0.0;
  (this->mControlPoints)._M_elems[1].y = 0.0;
  (this->mControlPoints)._M_elems[0].x = 0.0;
  (this->mControlPoints)._M_elems[0].y = 0.0;
  pVVar5 = (controlPoints->super__Vector_base<bezier::Vec2,_std::allocator<bezier::Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar3 = (controlPoints->super__Vector_base<bezier::Vec2,_std::allocator<bezier::Vec2>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)pVVar3 - (long)pVVar5 == 0x40) {
    if (pVVar3 != pVVar5) {
      lVar6 = 0;
      uVar7 = 0;
      do {
        puVar1 = (undefined8 *)((long)&pVVar5->x + lVar6);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(this->mControlPoints)._M_elems[0].x + lVar6);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        uVar7 = uVar7 + 1;
        pVVar5 = (controlPoints->super__Vector_base<bezier::Vec2,_std::allocator<bezier::Vec2>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        lVar6 = lVar6 + 0x10;
      } while (uVar7 < (ulong)((long)(controlPoints->
                                     super__Vector_base<bezier::Vec2,_std::allocator<bezier::Vec2>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5 >> 4
                              ));
    }
    return;
  }
  __assert_fail("controlPoints.size() == size()",
                "/workspace/llm4binary/github/license_c_cmakelists/oysteinmyrmo[P]bezier/include/bezier/bezier.h"
                ,0x278,"bezier::Bezier<3>::Bezier(const std::vector<Point> &) [N = 3]");
}

Assistant:

explicit Bezier(const std::vector<Point>& controlPoints)
        {
            assert(controlPoints.size() == size()); // The bezier curve must be initialized with the expected number of points
            for (size_t i = 0; i < controlPoints.size(); i++)
                mControlPoints[i] = Point(controlPoints[i]);
        }